

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::HasEnv(char *key)

{
  char *pcVar1;
  char *v;
  char *key_local;
  
  pcVar1 = getenv(key);
  return pcVar1 != (char *)0x0;
}

Assistant:

bool SystemTools::HasEnv(const char* key)
{
#if defined(_WIN32)
  const std::wstring wkey = Encoding::ToWide(key);
  const wchar_t* v = _wgetenv(wkey.c_str());
#else
  const char* v = getenv(key);
#endif
  return v != nullptr;
}